

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  string *name;
  char *pcVar1;
  pointer pbVar2;
  size_t __n;
  bool bVar3;
  bool bVar4;
  int iVar5;
  cmOrderDirectories *pcVar6;
  pointer __s1;
  pointer pbVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string lib;
  string ext;
  string fname;
  char *local_c0;
  size_t local_b8;
  char local_b0;
  undefined7 uStack_af;
  undefined1 *local_a0;
  size_t local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_t local_48;
  pointer local_40;
  undefined8 local_38;
  
  name = &(this->super_cmOrderDirectoriesConstraint).FileName;
  bVar3 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,name);
  bVar4 = true;
  if (!bVar3) {
    pcVar6 = (this->super_cmOrderDirectoriesConstraint).OD;
    if (((pcVar6->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pcVar6->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar3 = cmsys::RegularExpression::find
                          (&pcVar6->RemoveLibraryExtension,(name->_M_dataplus)._M_p,
                           &(pcVar6->RemoveLibraryExtension).regmatch), bVar3)) {
      pcVar6 = (this->super_cmOrderDirectoriesConstraint).OD;
      pcVar1 = (pcVar6->RemoveLibraryExtension).regmatch.startp[1];
      local_c0 = &local_b0;
      if (pcVar1 == (char *)0x0) {
        local_b8 = 0;
        local_b0 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,pcVar1,(pcVar6->RemoveLibraryExtension).regmatch.endp[1]);
        pcVar6 = (this->super_cmOrderDirectoriesConstraint).OD;
      }
      pcVar1 = (pcVar6->RemoveLibraryExtension).regmatch.startp[2];
      if (pcVar1 == (char *)0x0) {
        local_a0 = &local_90;
        local_98 = 0;
        local_90 = 0;
      }
      else {
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,pcVar1,(pcVar6->RemoveLibraryExtension).regmatch.endp[2]);
        pcVar6 = (this->super_cmOrderDirectoriesConstraint).OD;
      }
      pbVar7 = (pcVar6->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pcVar6->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      if (pbVar7 != pbVar2) {
        do {
          __n = pbVar7->_M_string_length;
          if (__n == local_98) {
            if (__n != 0) {
              __s1 = (pbVar7->_M_dataplus)._M_p;
              iVar5 = bcmp(__s1,local_a0,__n);
              if (iVar5 != 0) goto LAB_0054919a;
            }
          }
          else {
            __s1 = (pbVar7->_M_dataplus)._M_p;
LAB_0054919a:
            local_60.first._M_len = local_b8;
            local_60.first._M_str = local_c0;
            local_60.second =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_38 = 0;
            views._M_len = 2;
            views._M_array = &local_60;
            local_48 = __n;
            local_40 = __s1;
            cmCatViews(&local_80,views);
            bVar3 = cmOrderDirectoriesConstraint::FileMayConflict
                              (&this->super_cmOrderDirectoriesConstraint,dir,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if (bVar3) {
              bVar3 = false;
              goto LAB_00549233;
            }
          }
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != pbVar2);
        bVar3 = true;
      }
LAB_00549233:
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
      }
      if (!bVar3) {
        return true;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if (this->FileMayConflict(dir, this->FileName)) {
    return true;
  }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if (!this->OD->LinkExtensions.empty() &&
      this->OD->RemoveLibraryExtension.find(this->FileName)) {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for (std::string const& LinkExtension : this->OD->LinkExtensions) {
      if (LinkExtension != ext) {
        std::string fname = cmStrCat(lib, LinkExtension);
        if (this->FileMayConflict(dir, fname)) {
          return true;
        }
      }
    }
  }
  return false;
}